

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O1

void it_playing_update_resamplers(IT_PLAYING *playing)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  IT_SAMPLE *pIVar4;
  code *pcVar5;
  int32 iVar6;
  
  pIVar4 = playing->sample;
  bVar1 = pIVar4->flags;
  if (((bVar1 & 0x20) == 0) || ((playing->flags & 2) != 0)) {
    if ((bVar1 & 0x10) == 0) {
      if ((playing->flags & 0x10) != 0) {
        (playing->resampler).start = 0;
        (playing->resampler).end = pIVar4->length;
        (playing->resampler).dir = -1;
        pcVar5 = it_pickup_stop_after_reverse;
        goto LAB_006f0e95;
      }
      iVar6 = 0;
      if ((bVar1 & 0x20) != 0) {
        iVar6 = pIVar4->sus_loop_start;
      }
      (playing->resampler).start = iVar6;
      (playing->resampler).end = pIVar4->length;
    }
    else {
      iVar2 = pIVar4->loop_start;
      (playing->resampler).start = iVar2;
      iVar3 = pIVar4->loop_end;
      (playing->resampler).end = iVar3;
      if (iVar2 != iVar3) {
        if ((bVar1 & 0x40) != 0) goto LAB_006f0e8e;
        goto LAB_006f0e19;
      }
    }
  }
  else {
    iVar2 = pIVar4->sus_loop_start;
    (playing->resampler).start = iVar2;
    iVar3 = pIVar4->sus_loop_end;
    (playing->resampler).end = iVar3;
    if (iVar2 != iVar3) {
      if ((char)bVar1 < '\0') {
LAB_006f0e8e:
        pcVar5 = it_pickup_pingpong_loop;
        goto LAB_006f0e95;
      }
LAB_006f0e19:
      pcVar5 = it_pickup_loop;
      goto LAB_006f0e95;
    }
  }
  pcVar5 = it_pickup_stop_at_end;
LAB_006f0e95:
  (playing->resampler).pickup = pcVar5;
  return;
}

Assistant:

static void it_playing_update_resamplers(IT_PLAYING *playing)
{
	if ((playing->sample->flags & IT_SAMPLE_SUS_LOOP) && !(playing->flags & IT_PLAYING_SUSTAINOFF)) {
		playing->resampler.start = playing->sample->sus_loop_start;
		playing->resampler.end = playing->sample->sus_loop_end;
		if (playing->resampler.start == playing->resampler.end)
			playing->resampler.pickup = &it_pickup_stop_at_end;
		else if (playing->sample->flags & IT_SAMPLE_PINGPONG_SUS_LOOP)
			playing->resampler.pickup = &it_pickup_pingpong_loop;
		else
			playing->resampler.pickup = &it_pickup_loop;
	} else if (playing->sample->flags & IT_SAMPLE_LOOP) {
		playing->resampler.start = playing->sample->loop_start;
		playing->resampler.end = playing->sample->loop_end;
		if (playing->resampler.start == playing->resampler.end)
			playing->resampler.pickup = &it_pickup_stop_at_end;
		else if (playing->sample->flags & IT_SAMPLE_PINGPONG_LOOP)
			playing->resampler.pickup = &it_pickup_pingpong_loop;
		else
			playing->resampler.pickup = &it_pickup_loop;
	} else if (playing->flags & IT_PLAYING_REVERSE) {
		playing->resampler.start = 0;
		playing->resampler.end = playing->sample->length;
		playing->resampler.dir = -1;
		playing->resampler.pickup = &it_pickup_stop_after_reverse;
	} else {
		if (playing->sample->flags & IT_SAMPLE_SUS_LOOP)
			playing->resampler.start = playing->sample->sus_loop_start;
		else
			playing->resampler.start = 0;
		playing->resampler.end = playing->sample->length;
		playing->resampler.pickup = &it_pickup_stop_at_end;
	}
	ASSERT(playing->resampler.pickup_data == playing);
}